

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O1

int QuantizeBlock_C(int16_t *in,int16_t *out,VP8Matrix *mtx)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ushort uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar4 = 0xffffffff;
  uVar7 = 0;
  do {
    bVar1 = ""[uVar7];
    uVar2 = *(ushort *)((long)in + (ulong)((uint)bVar1 * 2));
    uVar6 = -uVar2;
    if (0 < (short)uVar2) {
      uVar6 = uVar2;
    }
    uVar5 = (uint)*(ushort *)((long)mtx->sharpen + (ulong)((uint)bVar1 * 2)) + (uint)uVar6;
    if (mtx->zthresh[bVar1] < uVar5) {
      uVar8 = (ulong)((uint)bVar1 + (uint)bVar1);
      uVar5 = uVar5 * *(ushort *)((long)mtx->iq + uVar8) + mtx->bias[bVar1] >> 0x11;
      if (0x7fe < uVar5) {
        uVar5 = 0x7ff;
      }
      uVar3 = -uVar5;
      if (-1 < (short)uVar2) {
        uVar3 = uVar5;
      }
      *(short *)((long)in + uVar8) = *(short *)((long)mtx->q + uVar8) * (short)uVar3;
      out[uVar7] = (short)uVar3;
      if (uVar3 != 0) {
        uVar4 = uVar7 & 0xffffffff;
      }
    }
    else {
      out[uVar7] = 0;
      in[bVar1] = 0;
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x10);
  return ~(uint)uVar4 >> 0x1f;
}

Assistant:

static int QuantizeBlock_C(int16_t in[16], int16_t out[16],
                           const VP8Matrix* WEBP_RESTRICT const mtx) {
  int last = -1;
  int n;
  for (n = 0; n < 16; ++n) {
    const int j = kZigzag[n];
    const int sign = (in[j] < 0);
    const uint32_t coeff = (sign ? -in[j] : in[j]) + mtx->sharpen[j];
    if (coeff > mtx->zthresh[j]) {
      const uint32_t Q = mtx->q[j];
      const uint32_t iQ = mtx->iq[j];
      const uint32_t B = mtx->bias[j];
      int level = QUANTDIV(coeff, iQ, B);
      if (level > MAX_LEVEL) level = MAX_LEVEL;
      if (sign) level = -level;
      in[j] = level * (int)Q;
      out[n] = level;
      if (level) last = n;
    } else {
      out[n] = 0;
      in[j] = 0;
    }
  }
  return (last >= 0);
}